

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
duckdb::AddConstraintInfo::Deserialize(Deserializer *deserializer)

{
  Deserializer *this;
  pointer ret;
  unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
  *in_RSI;
  AlterTableInfo *in_RDI;
  unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true> result
  ;
  pointer pAVar1;
  AddConstraintInfo *in_stack_ffffffffffffffb0;
  _Head_base<0UL,_duckdb::AlterTableInfo_*,_false> _Var2;
  undefined1 local_18 [24];
  
  _Var2._M_head_impl = in_RDI;
  local_18._8_8_ = in_RSI;
  this = (Deserializer *)operator_new(0x80);
  AddConstraintInfo(in_stack_ffffffffffffffb0);
  pAVar1 = (pointer)local_18;
  unique_ptr<duckdb::AddConstraintInfo,std::default_delete<duckdb::AddConstraintInfo>,true>::
  unique_ptr<std::default_delete<duckdb::AddConstraintInfo>,void>
            ((unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
              *)in_stack_ffffffffffffffb0,pAVar1);
  ret = unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
        ::operator->((unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
                      *)local_18._8_8_);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
            (this,(field_id_t)((ulong)_Var2._M_head_impl >> 0x30),(char *)in_RDI,
             (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)ret);
  unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>,true>::
  unique_ptr<duckdb::AddConstraintInfo,std::default_delete<std::unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>>>,void>
            ((unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
              *)local_18._8_8_,
             (unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>_>
              *)pAVar1);
  unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
               *)0xae341e);
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (_Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>)
         _Var2._M_head_impl;
}

Assistant:

unique_ptr<AlterTableInfo> AddConstraintInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<AddConstraintInfo>(new AddConstraintInfo());
	deserializer.ReadPropertyWithDefault<unique_ptr<Constraint>>(400, "constraint", result->constraint);
	return std::move(result);
}